

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O1

void testing::internal::PrintCharAndCodeTo<unsigned_char>(uchar c,ostream *os)

{
  undefined4 uVar1;
  long lVar2;
  bool bVar3;
  uint32_t value;
  long lVar4;
  int iVar5;
  char *pcVar6;
  undefined7 in_register_00000039;
  ulong uVar7;
  string local_38;
  
  uVar7 = CONCAT71(in_register_00000039,c);
  pcVar6 = (char *)&local_38;
  std::__ostream_insert<char,std::char_traits<char>>(os,"",0);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  iVar5 = (int)uVar7;
  switch(uVar7 & 0xffffffff) {
  case 0:
    pcVar6 = "\\0";
    break;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
switchD_0015c44a_caseD_1:
    if (0x5e < iVar5 - 0x20U) {
      uVar1 = *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
      std::__ostream_insert<char,std::char_traits<char>>(os,"\\x",2);
      lVar4 = *(long *)os;
      lVar2 = *(long *)(lVar4 + -0x18);
      *(uint *)(os + lVar2 + 0x18) = *(uint *)(os + lVar2 + 0x18) & 0xffffffb5 | 8;
      *(uint *)(os + *(long *)(lVar4 + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(lVar4 + -0x18) + 0x18) | 0x4000;
      std::ostream::operator<<(os,iVar5);
      *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18) = uVar1;
      bVar3 = true;
      goto LAB_0015c4d9;
    }
    lVar4 = 1;
    local_38._M_dataplus._M_p._0_1_ = c;
    goto LAB_0015c4ce;
  case 7:
    pcVar6 = "\\a";
    break;
  case 8:
    pcVar6 = "\\b";
    break;
  case 9:
    pcVar6 = "\\t";
    break;
  case 10:
    pcVar6 = "\\n";
    break;
  case 0xb:
    pcVar6 = "\\v";
    break;
  case 0xc:
    pcVar6 = "\\f";
    break;
  case 0xd:
    pcVar6 = "\\r";
    break;
  default:
    if (iVar5 == 0x27) {
      pcVar6 = "\\\'";
    }
    else {
      if (iVar5 != 0x5c) goto switchD_0015c44a_caseD_1;
      pcVar6 = "\\\\";
    }
  }
  lVar4 = 2;
LAB_0015c4ce:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,lVar4);
  bVar3 = false;
LAB_0015c4d9:
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  if (c != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    std::ostream::operator<<(os,iVar5);
    if (9 < c && !bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", 0x",4);
      String::FormatHexUInt32_abi_cxx11_(&local_38,(String *)(uVar7 & 0xffffffff),value);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,(char *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                     (uchar)local_38._M_dataplus._M_p),local_38._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(uchar)local_38._M_dataplus._M_p) !=
          &local_38.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_38._M_dataplus._M_p._1_7_,(uchar)local_38._M_dataplus._M_p),
                        local_38.field_2._M_allocated_capacity + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  }
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << GetCharWidthPrefix(c) << "'";
  const CharFormat format = PrintAsCharLiteralTo(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0) return;
  *os << " (" << static_cast<int>(c);

  // For more convenience, we print c's code again in hexadecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << ", 0x" << String::FormatHexInt(static_cast<int>(c));
  }
  *os << ")";
}